

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bms_channel.cpp
# Opt level: O0

bool __thiscall BmsChannel::IsShouldPlayWavChannel(BmsChannel *this)

{
  int iVar1;
  BmsChannel *this_local;
  
  iVar1 = GetChannelType(this);
  if ((((iVar1 == 1) || (iVar1 == 0xb)) || (iVar1 == 0x15)) || ((iVar1 == 0x33 || (iVar1 == 0x3d))))
  {
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool
BmsChannel::IsShouldPlayWavChannel(void) const
{
	// 01, 11 -- 1Z, 21 -- 2Z, 51 -- 5Z, 61 -- 6Z

	switch (GetChannelType()) {
	case BmsChannelType::BGM:
	case BmsChannelType::FIRSTPLAYER:
	case BmsChannelType::FIRSTPLAYERLN:
	case BmsChannelType::SECONDPLAYER:
	case BmsChannelType::SECONDPLAYERLN:
		return true;
	default:
		return false;
	}
}